

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite2_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite2_Test<absl::lts_20250127::Cord> *this)

{
  TypeParam extensions_data;
  TestAllExtensionsLite message;
  TestAllExtensionsLite message3;
  TestAllExtensionsLite message2;
  MessageLite MStack_a8;
  TestAllExtensionsLite local_98;
  TestAllExtensionsLite local_68;
  TestAllExtensionsLite local_38;
  
  proto2_unittest::TestAllExtensionsLite::TestAllExtensionsLite(&local_98,(Arena *)0x0);
  proto2_unittest::TestAllExtensionsLite::TestAllExtensionsLite(&local_38,(Arena *)0x0);
  proto2_unittest::TestAllExtensionsLite::TestAllExtensionsLite(&local_68,(Arena *)0x0);
  TestUtilLite::ExpectExtensionsClear(&local_98);
  TestUtilLite::SetAllExtensions(&local_98);
  proto2_unittest::TestAllExtensionsLite::CopyFrom(&local_38,&local_98);
  MessageLite::SerializeAsCord(&MStack_a8);
  MessageLite::ParseFromString(&local_68.super_MessageLite,(Cord *)&MStack_a8);
  TestUtilLite::ExpectAllExtensionsSet(&local_98);
  TestUtilLite::ExpectAllExtensionsSet(&local_38);
  TestUtilLite::ExpectAllExtensionsSet(&local_68);
  TestUtilLite::ModifyRepeatedExtensions(&local_98);
  TestUtilLite::ExpectRepeatedExtensionsModified(&local_98);
  proto2_unittest::TestAllExtensionsLite::Clear(&local_98);
  TestUtilLite::ExpectExtensionsClear(&local_98);
  absl::lts_20250127::Cord::~Cord((Cord *)&MStack_a8);
  proto2_unittest::TestAllExtensionsLite::~TestAllExtensionsLite(&local_68);
  proto2_unittest::TestAllExtensionsLite::~TestAllExtensionsLite(&local_38);
  proto2_unittest::TestAllExtensionsLite::~TestAllExtensionsLite(&local_98);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite2) {
  {
    proto2_unittest::TestAllExtensionsLite message, message2, message3;
    TestUtilLite::ExpectExtensionsClear(message);
    TestUtilLite::SetAllExtensions(&message);
    message2 = message;
    TypeParam extensions_data = SerializeAs<TypeParam>(message);
    ParseFrom(extensions_data, message3);
    TestUtilLite::ExpectAllExtensionsSet(message);
    TestUtilLite::ExpectAllExtensionsSet(message2);
    TestUtilLite::ExpectAllExtensionsSet(message3);
    TestUtilLite::ModifyRepeatedExtensions(&message);
    TestUtilLite::ExpectRepeatedExtensionsModified(message);
    message.Clear();
    TestUtilLite::ExpectExtensionsClear(message);
  }
}